

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::io::CordOutputStream::CordOutputStream
          (CordOutputStream *this,Cord *cord,size_t size_hint)

{
  CordRep *pCVar1;
  bool bVar2;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__CordOutputStream_0053f808;
  pCVar1 = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.cordz_info =
       (cord->contents_).data_.rep_.field_0.as_tree.cordz_info;
  (this->cord_).contents_.data_.rep_.field_0.as_tree.rep = pCVar1;
  (cord->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (cord->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  this->size_hint_ = size_hint;
  bVar2 = absl::lts_20250127::Cord::empty(&this->cord_);
  this->state_ = (uint)!bVar2 + (uint)!bVar2 * 2;
  (this->buffer_).rep_.field_0.short_rep.raw_size = '\x01';
  *(undefined8 *)((long)&(this->buffer_).rep_.field_0.long_rep.rep + 1) = 0;
  (this->buffer_).rep_.field_0.long_rep.padding = (void *)0x0;
  return;
}

Assistant:

CordOutputStream::CordOutputStream(absl::Cord cord, size_t size_hint)
    : cord_(std::move(cord)),
      size_hint_(size_hint),
      state_(cord_.empty() ? State::kEmpty : State::kSteal) {}